

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O1

bool OrderEdgesAroundOpenVertex(ON_Brep *B,int vid,ON_2dex *trim_ends)

{
  int iVar1;
  ON_BrepVertex *pOVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ON_BrepEdge *pOVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  long lVar12;
  byte bVar13;
  ON_BrepTrim *pOVar14;
  bool bVar15;
  
  if (-1 < vid) {
    pOVar2 = (B->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_a;
    if ((-1 < pOVar2[(uint)vid].m_vertex_index) &&
       (lVar9 = (long)pOVar2[(uint)vid].m_ei.m_count, 1 < lVar9)) {
      pOVar8 = (B->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
      uVar6 = 0xffffffff;
      lVar12 = 0;
      uVar5 = 0xffffffff;
      do {
        iVar7 = pOVar2[(uint)vid].m_ei.m_a[lVar12];
        uVar4 = uVar6;
        if (pOVar8[iVar7].m_edge_index < 0) {
          bVar13 = 0;
        }
        else {
          bVar13 = 1;
          if (((pOVar8[iVar7].m_ti.m_count == 1) && (uVar4 = (uint)lVar12, -1 < (int)uVar6)) &&
             (bVar13 = (byte)(uVar5 >> 0x1f), uVar4 = uVar6, (int)uVar5 < 0)) {
            uVar5 = (uint)lVar12;
          }
        }
        uVar6 = uVar4;
        if (bVar13 == 0) {
          return false;
        }
        lVar12 = lVar12 + 1;
      } while (lVar9 != lVar12);
      if (-1 < (int)(uVar6 | uVar5)) {
        iVar7 = pOVar2[(uint)vid].m_ei.m_a[uVar6];
        pOVar8 = (B->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
        pOVar14 = (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
        iVar1 = pOVar8[iVar7].m_vi[0];
        iVar7 = *pOVar8[iVar7].m_ti.m_a;
        trim_ends->i = iVar7;
        trim_ends->j = (uint)(pOVar14[iVar7].m_bRev3d == (iVar1 == vid));
        uVar10 = 0;
        bVar11 = false;
        while ((long)uVar10 < (long)pOVar2[(uint)vid].m_ei.m_count) {
          if (trim_ends[uVar10].j == 0) {
            uVar6 = ON_Brep::PrevNonsingularTrim(B,trim_ends[uVar10].i);
          }
          else {
            uVar6 = ON_Brep::NextNonsingularTrim(B,trim_ends[uVar10].i);
          }
          if ((int)uVar6 < 0) {
            bVar15 = false;
            bVar11 = false;
          }
          else {
            pOVar14 = (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                      m_a + uVar6;
            pOVar8 = ON_BrepTrim::Edge(pOVar14);
            if ((pOVar8 == (ON_BrepEdge *)0x0) || (iVar7 = (pOVar8->m_ti).m_count, 2 < iVar7)) {
LAB_0041cc3d:
              bVar11 = false;
              bVar15 = false;
            }
            else {
              bVar15 = iVar7 != 1;
              if (bVar15) {
                puVar3 = (uint *)(pOVar8->m_ti).m_a;
                uVar6 = puVar3[*puVar3 == uVar6];
                trim_ends[uVar10 + 1].i = uVar6;
                iVar7 = 1 - trim_ends[uVar10].j;
                if ((B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a
                    [(int)uVar6].m_bRev3d != pOVar14->m_bRev3d) {
                  iVar7 = trim_ends[uVar10].j;
                }
              }
              else {
                if ((pOVar14->m_ei != pOVar2[(uint)vid].m_ei.m_a[uVar5]) ||
                   (uVar10 != pOVar2[(uint)vid].m_ei.m_count - 2)) goto LAB_0041cc3d;
                trim_ends[uVar10 + 1].i = uVar6;
                iVar7 = 1 - trim_ends[uVar10].j;
                bVar11 = true;
              }
              trim_ends[uVar10 + 1].j = iVar7;
            }
          }
          uVar10 = uVar10 + 1;
          if (!bVar15) {
            return bVar11;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool OrderEdgesAroundOpenVertex(const ON_Brep& B, int vid, ON_2dex* trim_ends)

{
  if (vid<0)
    return false;
  const ON_BrepVertex& V = B.m_V[vid];
  if (V.m_vertex_index < 0)
    return false;
  if (V.m_ei.Count() < 2)
    return false;
  int i;
  int start = -1;
  int end = -1;
  for (i=0; i<V.m_ei.Count(); i++){
    const ON_BrepEdge& E = B.m_E[V.m_ei[i]];
    if (E.m_edge_index < 0)
      return false;
    if (E.m_ti.Count() == 1){
      if (start < 0)
        start = i;
      else if (end < 0)
        end = i;
      else
        return false;
    }
  }
  if (start < 0 || end < 0)
    return false;
  const ON_BrepEdge& StartE = B.m_E[V.m_ei[start]];
  bool bAtStart = (StartE.m_vi[0] == vid) ? true : false;
  const ON_BrepTrim& StartT = B.m_T[StartE.m_ti[0]];
  ON_2dex& start_te = trim_ends[0];
  start_te.i = StartE.m_ti[0];
  start_te.j = (bAtStart == StartT.m_bRev3d) ? 1 : 0;
  int count = 0;
  while (count < V.m_ei.Count()){
    const ON_2dex& lte = trim_ends[count];
    count++;
    int next_ti =  (lte.j) ? B.NextNonsingularTrim(lte.i) : B.PrevNonsingularTrim(lte.i);
   if (next_ti<0)
     return false;
   const ON_BrepTrim& NT = B.m_T[next_ti];
   const ON_BrepEdge* pNE = NT.Edge();
   if (!pNE)
     return false;
   if (pNE->m_ti.Count() > 2)
     return false;
   if (pNE->m_ti.Count() == 1){
     if (NT.m_ei == V.m_ei[end]){
       if (count != V.m_ei.Count()-1)
         return false;
       ON_2dex& end_te = trim_ends[count];
       end_te.i = next_ti;
       end_te.j = 1-lte.j;
       return true;
     }
     return false;
   }
   ON_2dex& nte = trim_ends[count];
   nte.i = (pNE->m_ti[0] == next_ti) ? pNE->m_ti[1] : pNE->m_ti[0];
   const ON_BrepTrim& NTi = B.m_T[nte.i];
   nte.j = (NTi.m_bRev3d == NT.m_bRev3d) ? 1-lte.j : lte.j;
  }
  return false;
}